

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O0

void __thiscall
Js::DebugContext::WalkAndAddUtf8SourceInfo
          (DebugContext *this,Utf8SourceInfo *sourceInfo,
          List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
          *utf8SourceInfoList)

{
  code *pcVar1;
  anon_class_16_2_5a6a0044_for_map map;
  List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
  *pLVar2;
  bool bVar3;
  ScriptContext *pSVar4;
  ScriptContext *pSVar5;
  ScriptContext *pSVar6;
  undefined4 *puVar7;
  bool local_31;
  ScriptContext *pSStack_30;
  bool found;
  ScriptContext *callerScriptContext;
  Utf8SourceInfo *callerUtf8SourceInfo;
  List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
  *utf8SourceInfoList_local;
  Utf8SourceInfo *sourceInfo_local;
  DebugContext *this_local;
  
  callerUtf8SourceInfo = (Utf8SourceInfo *)utf8SourceInfoList;
  utf8SourceInfoList_local =
       (List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
        *)sourceInfo;
  sourceInfo_local = (Utf8SourceInfo *)this;
  callerScriptContext = (ScriptContext *)Utf8SourceInfo::GetCallerUtf8SourceInfo(sourceInfo);
  if (callerScriptContext != (ScriptContext *)0x0) {
    pSStack_30 = Utf8SourceInfo::GetScriptContext((Utf8SourceInfo *)callerScriptContext);
    pLVar2 = utf8SourceInfoList_local;
    pSVar6 = callerScriptContext;
    pSVar5 = this->scriptContext;
    pSVar4 = Utf8SourceInfo::GetScriptContext((Utf8SourceInfo *)utf8SourceInfoList_local);
    Output::Trace(DebuggerPhase,
                  L"DebugContext::WalkAndAddUtf8SourceInfo scriptContext 0x%p, sourceInfo 0x%p, callerUtf8SourceInfo 0x%p, sourceInfo scriptContext 0x%p, callerUtf8SourceInfo scriptContext 0x%p\n"
                  ,pSVar5,pLVar2,pSVar6,pSVar4,pSStack_30);
    pSVar5 = Utf8SourceInfo::GetScriptContext((Utf8SourceInfo *)utf8SourceInfoList_local);
    if (pSVar5 == pSStack_30) {
      WalkAndAddUtf8SourceInfo
                (this,(Utf8SourceInfo *)callerScriptContext,
                 (List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
                  *)callerUtf8SourceInfo);
    }
    else {
      bVar3 = ScriptContext::IsScriptContextInNonDebugMode(pSStack_30);
      if (bVar3) {
        ScriptContext::AddCalleeSourceInfoToList
                  (pSStack_30,(Utf8SourceInfo *)utf8SourceInfoList_local);
      }
    }
  }
  bVar3 = JsUtil::ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>::
          Contains((ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer> *)
                   callerUtf8SourceInfo,(Utf8SourceInfo **)&utf8SourceInfoList_local);
  pLVar2 = utf8SourceInfoList_local;
  if (!bVar3) {
    pSVar5 = this->scriptContext;
    pSVar6 = Utf8SourceInfo::GetScriptContext((Utf8SourceInfo *)utf8SourceInfoList_local);
    Output::Trace(DebuggerPhase,
                  L"DebugContext::WalkAndAddUtf8SourceInfo Adding to utf8SourceInfoList scriptContext 0x%p, sourceInfo 0x%p, sourceInfo scriptContext 0x%p\n"
                  ,pSVar5,pLVar2,pSVar6);
    local_31 = false;
    map.found = &local_31;
    map.sourceInfo = (Utf8SourceInfo **)&utf8SourceInfoList_local;
    MapUTF8SourceInfoUntil<Js::DebugContext::WalkAndAddUtf8SourceInfo(Js::Utf8SourceInfo*,JsUtil::List<Js::Utf8SourceInfo*,Memory::Recycler,false,Js::CopyRemovePolicy,RecyclerPointerComparer>*)::__0>
              (this,map);
    if ((local_31 & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                  ,0x1b0,"(found)","Parented eval feature have extra source");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    JsUtil::
    List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
    ::Add((List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
           *)callerUtf8SourceInfo,(Utf8SourceInfo **)&utf8SourceInfoList_local);
  }
  return;
}

Assistant:

void DebugContext::WalkAndAddUtf8SourceInfo(Js::Utf8SourceInfo* sourceInfo, JsUtil::List<Js::Utf8SourceInfo *, Recycler, false, Js::CopyRemovePolicy, RecyclerPointerComparer> *utf8SourceInfoList)
    {
        Js::Utf8SourceInfo* callerUtf8SourceInfo = sourceInfo->GetCallerUtf8SourceInfo();
        if (callerUtf8SourceInfo)
        {
            Js::ScriptContext* callerScriptContext = callerUtf8SourceInfo->GetScriptContext();
            OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::WalkAndAddUtf8SourceInfo scriptContext 0x%p, sourceInfo 0x%p, callerUtf8SourceInfo 0x%p, sourceInfo scriptContext 0x%p, callerUtf8SourceInfo scriptContext 0x%p\n"),
                this->scriptContext, sourceInfo, callerUtf8SourceInfo, sourceInfo->GetScriptContext(), callerScriptContext);

            if (sourceInfo->GetScriptContext() == callerScriptContext)
            {
                WalkAndAddUtf8SourceInfo(callerUtf8SourceInfo, utf8SourceInfoList);
            }
            else if (callerScriptContext->IsScriptContextInNonDebugMode())
            {
                // The caller scriptContext is not in run down/debug mode so let's save the relationship so that we can re-parent callees afterwards.
                callerScriptContext->AddCalleeSourceInfoToList(sourceInfo);
            }
        }
        if (!utf8SourceInfoList->Contains(sourceInfo))
        {
            OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::WalkAndAddUtf8SourceInfo Adding to utf8SourceInfoList scriptContext 0x%p, sourceInfo 0x%p, sourceInfo scriptContext 0x%p\n"),
                this->scriptContext, sourceInfo, sourceInfo->GetScriptContext());
#if DBG
            bool found = false;
            this->MapUTF8SourceInfoUntil([&](Js::Utf8SourceInfo * sourceInfoTemp) -> bool
            {
                if (sourceInfoTemp == sourceInfo)
                {
                    found = true;
                }
                return found;
            });
            AssertMsg(found, "Parented eval feature have extra source");
#endif
            utf8SourceInfoList->Add(sourceInfo);
        }
    }